

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O1

Gia_Man_t * Gia_ManSeqStructSweep(Gia_Man_t *p,int fConst,int fEquiv,int fVerbose)

{
  Gia_Man_t *pNew;
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  
  pGVar2 = (Gia_Man_t *)(ulong)(uint)fConst;
  if (p->nRegs != 0) {
    if (fVerbose != 0) {
      puts("Performing sequential cleanup.");
    }
    Gia_ManSeqMarkUsed(p);
    pNew = Gia_ManDupMarked(p);
    if (fVerbose != 0) {
      pGVar2 = pNew;
      Gia_ManReportImprovement(p,pNew);
    }
    if ((fConst != 0) && (pNew->nRegs != 0)) {
      pGVar2 = (Gia_Man_t *)(ulong)(uint)fVerbose;
      pGVar1 = Gia_ManReduceConst(pNew,fVerbose);
      if (fVerbose != 0) {
        pGVar2 = pGVar1;
        Gia_ManReportImprovement(pNew,pGVar1);
      }
      Gia_ManStop(pNew);
      pNew = pGVar1;
    }
    if (fEquiv != 0 && fVerbose != 0) {
      puts("Merging combinationally equivalent flops.");
    }
    if (fEquiv != 0) {
      while( true ) {
        Gia_ManSeqMarkUsed(pNew);
        pGVar1 = Gia_ManDupMarked(pNew);
        if (fVerbose != 0) {
          pGVar2 = pGVar1;
          Gia_ManReportImprovement(pNew,pGVar1);
        }
        Gia_ManStop(pNew);
        pNew = pGVar1;
        if ((pGVar1->nRegs == 0) || (pNew = Gia_ManReduceEquiv(pGVar1,(int)pGVar2), pNew == pGVar1))
        break;
        Gia_ManStop(pGVar1);
      }
    }
    return pNew;
  }
  Gia_ManCombMarkUsed(p);
  pGVar2 = Gia_ManDupMarked(p);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManSeqStructSweep( Gia_Man_t * p, int fConst, int fEquiv, int fVerbose )
{
    Gia_Man_t * pTemp;
    if ( Gia_ManRegNum(p) == 0 )
        return Gia_ManCleanup( p );
    if ( fVerbose )
        printf( "Performing sequential cleanup.\n" );
    p = Gia_ManSeqCleanup( pTemp = p );
    if ( fVerbose )
        Gia_ManReportImprovement( pTemp, p );
    if ( fConst && Gia_ManRegNum(p) )
    {
        p = Gia_ManReduceConst( pTemp = p, fVerbose );
        if ( fVerbose )
            Gia_ManReportImprovement( pTemp, p );
        Gia_ManStop( pTemp );
    }
    if ( fVerbose && fEquiv )
        printf( "Merging combinationally equivalent flops.\n" );
    if ( fEquiv )
    while ( 1 )
    {
        p = Gia_ManSeqCleanup( pTemp = p );
        if ( fVerbose )
            Gia_ManReportImprovement( pTemp, p );
        Gia_ManStop( pTemp );
        if ( Gia_ManRegNum(p) == 0 )
            break;
        p = Gia_ManReduceEquiv( pTemp = p, fVerbose );
        if ( p == pTemp )
            break;
        Gia_ManStop( pTemp );
    }
    return p;
}